

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O1

DateTimePatternGenerator * __thiscall
icu_63::DateTimePatternGenerator::operator=
          (DateTimePatternGenerator *this,DateTimePatternGenerator *other)

{
  UErrorCode *status;
  FormatParser *pFVar1;
  FormatParser *pFVar2;
  DateTimeMatcher *pDVar3;
  DistanceInfo *pDVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  PtnSkeleton *pPVar12;
  TokenStatus TVar13;
  int32_t iVar14;
  DateTimeMatcher *pDVar15;
  int32_t i;
  UnicodeString *src;
  long lVar16;
  undefined1 *puVar17;
  long lVar18;
  undefined1 *puVar19;
  
  if (other != this) {
    status = &this->internalErrorCode;
    this->internalErrorCode = other->internalErrorCode;
    Locale::operator=(&this->pLocale,&other->pLocale);
    this->fDefaultHourFormatChar = other->fDefaultHourFormatChar;
    pFVar1 = other->fp;
    pFVar2 = this->fp;
    lVar18 = 8;
    do {
      icu_63::UnicodeString::operator=
                ((UnicodeString *)((long)&pFVar2->_vptr_FormatParser + lVar18),
                 (UnicodeString *)((long)&pFVar1->_vptr_FormatParser + lVar18));
      lVar18 = lVar18 + 0x40;
    } while (lVar18 != 0xc88);
    TVar13 = pFVar1->status;
    pFVar2->itemNumber = pFVar1->itemNumber;
    pFVar2->status = TVar13;
    pDVar15 = this->dtMatcher;
    pDVar3 = other->dtMatcher;
    uVar5 = *(undefined8 *)(pDVar3->skeleton).type;
    uVar6 = *(undefined8 *)((pDVar3->skeleton).type + 2);
    uVar7 = *(undefined8 *)((pDVar3->skeleton).type + 4);
    uVar8 = *(undefined8 *)((pDVar3->skeleton).type + 6);
    uVar9 = *(undefined8 *)((pDVar3->skeleton).type + 8);
    uVar10 = *(undefined8 *)((pDVar3->skeleton).type + 10);
    uVar11 = *(undefined8 *)((pDVar3->skeleton).type + 0xe);
    *(undefined8 *)((pDVar15->skeleton).type + 0xc) = *(undefined8 *)((pDVar3->skeleton).type + 0xc)
    ;
    *(undefined8 *)((pDVar15->skeleton).type + 0xe) = uVar11;
    *(undefined8 *)((pDVar15->skeleton).type + 8) = uVar9;
    *(undefined8 *)((pDVar15->skeleton).type + 10) = uVar10;
    *(undefined8 *)((pDVar15->skeleton).type + 4) = uVar7;
    *(undefined8 *)((pDVar15->skeleton).type + 6) = uVar8;
    *(undefined8 *)(pDVar15->skeleton).type = uVar5;
    *(undefined8 *)((pDVar15->skeleton).type + 2) = uVar6;
    uVar5 = *(undefined8 *)((pDVar3->skeleton).original.chars + 8);
    *(undefined8 *)(pDVar15->skeleton).original.chars =
         *(undefined8 *)(pDVar3->skeleton).original.chars;
    *(undefined8 *)((pDVar15->skeleton).original.chars + 8) = uVar5;
    uVar5 = *(undefined8 *)((pDVar3->skeleton).original.lengths + 8);
    *(undefined8 *)(pDVar15->skeleton).original.lengths =
         *(undefined8 *)(pDVar3->skeleton).original.lengths;
    *(undefined8 *)((pDVar15->skeleton).original.lengths + 8) = uVar5;
    uVar5 = *(undefined8 *)((pDVar3->skeleton).baseOriginal.chars + 8);
    *(undefined8 *)(pDVar15->skeleton).baseOriginal.chars =
         *(undefined8 *)(pDVar3->skeleton).baseOriginal.chars;
    *(undefined8 *)((pDVar15->skeleton).baseOriginal.chars + 8) = uVar5;
    uVar5 = *(undefined8 *)((pDVar3->skeleton).baseOriginal.lengths + 8);
    *(undefined8 *)(pDVar15->skeleton).baseOriginal.lengths =
         *(undefined8 *)(pDVar3->skeleton).baseOriginal.lengths;
    *(undefined8 *)((pDVar15->skeleton).baseOriginal.lengths + 8) = uVar5;
    pDVar4 = this->distanceInfo;
    iVar14 = other->distanceInfo->extraFieldMask;
    pDVar4->missingFieldMask = other->distanceInfo->missingFieldMask;
    pDVar4->extraFieldMask = iVar14;
    icu_63::UnicodeString::operator=(&this->dateTimeFormat,&other->dateTimeFormat);
    src = &other->decimal;
    icu_63::UnicodeString::operator=(&this->decimal,src);
    icu_63::UnicodeString::getTerminatedBuffer(&this->dateTimeFormat);
    icu_63::UnicodeString::getTerminatedBuffer(&this->decimal);
    if (this->skipMatcher != (DateTimeMatcher *)0x0) {
      (*this->skipMatcher->_vptr_DateTimeMatcher[1])();
    }
    if (other->skipMatcher == (DateTimeMatcher *)0x0) {
      this->skipMatcher = (DateTimeMatcher *)0x0;
    }
    else {
      pDVar15 = (DateTimeMatcher *)UMemory::operator_new((UMemory *)0x98,(size_t)src);
      if (pDVar15 == (DateTimeMatcher *)0x0) {
        pDVar15 = (DateTimeMatcher *)0x0;
      }
      else {
        pDVar3 = other->skipMatcher;
        pDVar15->_vptr_DateTimeMatcher = (_func_int **)&PTR__DateTimeMatcher_0047d800;
        (pDVar15->skeleton)._vptr_PtnSkeleton = (_func_int **)&PTR__PtnSkeleton_0047d868;
        (pDVar15->skeleton).original.chars[0] = '\0';
        (pDVar15->skeleton).original.chars[1] = '\0';
        (pDVar15->skeleton).original.chars[2] = '\0';
        (pDVar15->skeleton).original.chars[3] = '\0';
        (pDVar15->skeleton).original.chars[4] = '\0';
        (pDVar15->skeleton).original.chars[5] = '\0';
        (pDVar15->skeleton).original.chars[6] = '\0';
        (pDVar15->skeleton).original.chars[7] = '\0';
        pPVar12 = &pDVar15->skeleton;
        (pPVar12->original).chars[8] = '\0';
        (pPVar12->original).chars[9] = '\0';
        (pPVar12->original).chars[10] = '\0';
        (pPVar12->original).chars[0xb] = '\0';
        (pPVar12->original).chars[0xc] = '\0';
        (pPVar12->original).chars[0xd] = '\0';
        (pPVar12->original).chars[0xe] = '\0';
        (pPVar12->original).chars[0xf] = '\0';
        (pDVar15->skeleton).original.lengths[0] = '\0';
        (pDVar15->skeleton).original.lengths[1] = '\0';
        (pDVar15->skeleton).original.lengths[2] = '\0';
        (pDVar15->skeleton).original.lengths[3] = '\0';
        (pDVar15->skeleton).original.lengths[4] = '\0';
        (pDVar15->skeleton).original.lengths[5] = '\0';
        (pDVar15->skeleton).original.lengths[6] = '\0';
        (pDVar15->skeleton).original.lengths[7] = '\0';
        pPVar12 = &pDVar15->skeleton;
        (pPVar12->original).lengths[8] = '\0';
        (pPVar12->original).lengths[9] = '\0';
        (pPVar12->original).lengths[10] = '\0';
        (pPVar12->original).lengths[0xb] = '\0';
        (pPVar12->original).lengths[0xc] = '\0';
        (pPVar12->original).lengths[0xd] = '\0';
        (pPVar12->original).lengths[0xe] = '\0';
        (pPVar12->original).lengths[0xf] = '\0';
        (pDVar15->skeleton).baseOriginal.chars[0] = '\0';
        (pDVar15->skeleton).baseOriginal.chars[1] = '\0';
        (pDVar15->skeleton).baseOriginal.chars[2] = '\0';
        (pDVar15->skeleton).baseOriginal.chars[3] = '\0';
        (pDVar15->skeleton).baseOriginal.chars[4] = '\0';
        (pDVar15->skeleton).baseOriginal.chars[5] = '\0';
        (pDVar15->skeleton).baseOriginal.chars[6] = '\0';
        (pDVar15->skeleton).baseOriginal.chars[7] = '\0';
        pPVar12 = &pDVar15->skeleton;
        (pPVar12->baseOriginal).chars[8] = '\0';
        (pPVar12->baseOriginal).chars[9] = '\0';
        (pPVar12->baseOriginal).chars[10] = '\0';
        (pPVar12->baseOriginal).chars[0xb] = '\0';
        (pPVar12->baseOriginal).chars[0xc] = '\0';
        (pPVar12->baseOriginal).chars[0xd] = '\0';
        (pPVar12->baseOriginal).chars[0xe] = '\0';
        (pPVar12->baseOriginal).chars[0xf] = '\0';
        (pDVar15->skeleton).baseOriginal.lengths[0] = '\0';
        (pDVar15->skeleton).baseOriginal.lengths[1] = '\0';
        (pDVar15->skeleton).baseOriginal.lengths[2] = '\0';
        (pDVar15->skeleton).baseOriginal.lengths[3] = '\0';
        (pDVar15->skeleton).baseOriginal.lengths[4] = '\0';
        (pDVar15->skeleton).baseOriginal.lengths[5] = '\0';
        (pDVar15->skeleton).baseOriginal.lengths[6] = '\0';
        (pDVar15->skeleton).baseOriginal.lengths[7] = '\0';
        pPVar12 = &pDVar15->skeleton;
        (pPVar12->baseOriginal).lengths[8] = '\0';
        (pPVar12->baseOriginal).lengths[9] = '\0';
        (pPVar12->baseOriginal).lengths[10] = '\0';
        (pPVar12->baseOriginal).lengths[0xb] = '\0';
        (pPVar12->baseOriginal).lengths[0xc] = '\0';
        (pPVar12->baseOriginal).lengths[0xd] = '\0';
        (pPVar12->baseOriginal).lengths[0xe] = '\0';
        (pPVar12->baseOriginal).lengths[0xf] = '\0';
        uVar5 = *(undefined8 *)(pDVar3->skeleton).type;
        uVar6 = *(undefined8 *)((pDVar3->skeleton).type + 2);
        uVar7 = *(undefined8 *)((pDVar3->skeleton).type + 4);
        uVar8 = *(undefined8 *)((pDVar3->skeleton).type + 6);
        uVar9 = *(undefined8 *)((pDVar3->skeleton).type + 8);
        uVar10 = *(undefined8 *)((pDVar3->skeleton).type + 10);
        uVar11 = *(undefined8 *)((pDVar3->skeleton).type + 0xe);
        *(undefined8 *)((pDVar15->skeleton).type + 0xc) =
             *(undefined8 *)((pDVar3->skeleton).type + 0xc);
        *(undefined8 *)((pDVar15->skeleton).type + 0xe) = uVar11;
        *(undefined8 *)((pDVar15->skeleton).type + 8) = uVar9;
        *(undefined8 *)((pDVar15->skeleton).type + 10) = uVar10;
        *(undefined8 *)((pDVar15->skeleton).type + 4) = uVar7;
        *(undefined8 *)((pDVar15->skeleton).type + 6) = uVar8;
        *(undefined8 *)(pDVar15->skeleton).type = uVar5;
        *(undefined8 *)((pDVar15->skeleton).type + 2) = uVar6;
        uVar5 = *(undefined8 *)((pDVar3->skeleton).original.chars + 8);
        *(undefined8 *)(pDVar15->skeleton).original.chars =
             *(undefined8 *)(pDVar3->skeleton).original.chars;
        *(undefined8 *)((pDVar15->skeleton).original.chars + 8) = uVar5;
        uVar5 = *(undefined8 *)((pDVar3->skeleton).original.lengths + 8);
        *(undefined8 *)(pDVar15->skeleton).original.lengths =
             *(undefined8 *)(pDVar3->skeleton).original.lengths;
        *(undefined8 *)((pDVar15->skeleton).original.lengths + 8) = uVar5;
        uVar5 = *(undefined8 *)((pDVar3->skeleton).baseOriginal.chars + 8);
        *(undefined8 *)(pDVar15->skeleton).baseOriginal.chars =
             *(undefined8 *)(pDVar3->skeleton).baseOriginal.chars;
        *(undefined8 *)((pDVar15->skeleton).baseOriginal.chars + 8) = uVar5;
        uVar5 = *(undefined8 *)((pDVar3->skeleton).baseOriginal.lengths + 8);
        *(undefined8 *)(pDVar15->skeleton).baseOriginal.lengths =
             *(undefined8 *)(pDVar3->skeleton).baseOriginal.lengths;
        *(undefined8 *)((pDVar15->skeleton).baseOriginal.lengths + 8) = uVar5;
      }
      this->skipMatcher = pDVar15;
      if (pDVar15 == (DateTimeMatcher *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return this;
      }
    }
    puVar17 = &other->field_0x508;
    puVar19 = &this->field_0x508;
    lVar18 = 0;
    do {
      icu_63::UnicodeString::operator=
                ((UnicodeString *)(&this->field_0x108 + lVar18 * 0x40),
                 (UnicodeString *)(&other->field_0x108 + lVar18 * 0x40));
      icu_63::UnicodeString::getTerminatedBuffer
                ((UnicodeString *)(&this->field_0x108 + lVar18 * 0x40));
      lVar16 = 0;
      do {
        icu_63::UnicodeString::operator=
                  ((UnicodeString *)(puVar19 + lVar16),(UnicodeString *)(puVar17 + lVar16));
        icu_63::UnicodeString::getTerminatedBuffer((UnicodeString *)(puVar19 + lVar16));
        lVar16 = lVar16 + 0x40;
      } while (lVar16 != 0xc0);
      lVar18 = lVar18 + 1;
      puVar17 = puVar17 + 0xc0;
      puVar19 = puVar19 + 0xc0;
    } while (lVar18 != 0x10);
    PatternMap::copyFrom(this->patternMap,other->patternMap,status);
    copyHashtable(this,other->fAvailableFormatKeyHash,status);
  }
  return this;
}

Assistant:

DateTimePatternGenerator&
DateTimePatternGenerator::operator=(const DateTimePatternGenerator& other) {
    // reflexive case
    if (&other == this) {
        return *this;
    }
    internalErrorCode = other.internalErrorCode;
    pLocale = other.pLocale;
    fDefaultHourFormatChar = other.fDefaultHourFormatChar;
    *fp = *(other.fp);
    dtMatcher->copyFrom(other.dtMatcher->skeleton);
    *distanceInfo = *(other.distanceInfo);
    dateTimeFormat = other.dateTimeFormat;
    decimal = other.decimal;
    // NUL-terminate for the C API.
    dateTimeFormat.getTerminatedBuffer();
    decimal.getTerminatedBuffer();
    delete skipMatcher;
    if ( other.skipMatcher == nullptr ) {
        skipMatcher = nullptr;
    }
    else {
        skipMatcher = new DateTimeMatcher(*other.skipMatcher);
        if (skipMatcher == nullptr)
        {
            internalErrorCode = U_MEMORY_ALLOCATION_ERROR;
            return *this;
        }
    }
    for (int32_t i=0; i< UDATPG_FIELD_COUNT; ++i ) {
        appendItemFormats[i] = other.appendItemFormats[i];
        appendItemFormats[i].getTerminatedBuffer(); // NUL-terminate for the C API.
        for (int32_t j=0; j< UDATPG_WIDTH_COUNT; ++j ) {
            fieldDisplayNames[i][j] = other.fieldDisplayNames[i][j];
            fieldDisplayNames[i][j].getTerminatedBuffer(); // NUL-terminate for the C API.
        }
    }
    patternMap->copyFrom(*other.patternMap, internalErrorCode);
    copyHashtable(other.fAvailableFormatKeyHash, internalErrorCode);
    return *this;
}